

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snappy.cc
# Opt level: O0

bool __thiscall
duckdb_snappy::SnappyScatteredWriter<duckdb_snappy::SnappySinkAllocator>::TryFastAppend
          (SnappyScatteredWriter<duckdb_snappy::SnappySinkAllocator> *this,char *ip,size_t available
          ,size_t length,char **op_p)

{
  void *dst;
  ulong in_RCX;
  ulong in_RDX;
  void *in_RSI;
  long in_RDI;
  long *in_R8;
  int space_left;
  char *op;
  undefined1 local_1;
  
  dst = (void *)*in_R8;
  if (((in_RCX < 0x11) && (0x14 < in_RDX)) && (0xf < (int)*(undefined8 *)(in_RDI + 0x58) - (int)dst)
     ) {
    anon_unknown_3::UnalignedCopy128(in_RSI,dst);
    *in_R8 = (long)dst + in_RCX;
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

inline bool TryFastAppend(const char* ip, size_t available, size_t length,
                            char** op_p) {
    char* op = *op_p;
    const int space_left = op_limit_ - op;
    if (length <= 16 && available >= 16 + kMaximumTagLength &&
        space_left >= 16) {
      // Fast path, used for the majority (about 95%) of invocations.
      UnalignedCopy128(ip, op);
      *op_p = op + length;
      return true;
    } else {
      return false;
    }
  }